

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

optional<wasm::Name> * __thiscall
wasm::WATParser::anon_unknown_11::ParseInput::takeID
          (optional<wasm::Name> *__return_storage_ptr__,ParseInput *this)

{
  undefined1 local_b8 [8];
  optional<wasm::WATParser::Token> t;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> id;
  char *pcStack_50;
  string local_48;
  allocator<char> local_21;
  
  peek((optional<wasm::WATParser::Token> *)local_b8,this);
  if ((t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
       super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       ._M_index == '\x01') &&
     (Token::getID((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                   (Token *)local_b8),
     id.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
     _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
     ._M_payload._8_1_ == '\x01')) {
    Lexer::operator++(&this->lexer);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_48,
               (basic_string_view<char,_std::char_traits<char>_> *)
               &t.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,&local_21);
    IString::IString((IString *)
                     &id.
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._M_engaged,&local_48);
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
         id.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_
    ;
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
         pcStack_50;
    (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
    super__Optional_payload_base<wasm::Name>._M_engaged = true;
    std::__cxx11::string::~string((string *)&local_48);
    std::_Optional_payload_base<wasm::WATParser::Token>::_M_reset
              ((_Optional_payload_base<wasm::WATParser::Token> *)local_b8);
    return __return_storage_ptr__;
  }
  std::_Optional_payload_base<wasm::WATParser::Token>::_M_reset
            ((_Optional_payload_base<wasm::WATParser::Token> *)local_b8);
  (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::Name>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Name> takeID() {
    if (auto t = peek()) {
      if (auto id = t->getID()) {
        ++lexer;
        // See comment on takeName.
        return Name(std::string(*id));
      }
    }
    return {};
  }